

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-stats.c
# Opt level: O0

sexp_conflict sexp_heap_walk(sexp_conflict ctx,int depth,int printp)

{
  undefined8 uVar1;
  long lVar2;
  int in_EDX;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp_conflict name;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict stats_res;
  char *end;
  sexp_free_list_conflict r;
  sexp_free_list_conflict q;
  sexp_conflict out;
  sexp_conflict p;
  sexp_heap_conflict h;
  sexp_sint_t i;
  sexp_uint_t size;
  sexp_uint_t hi_type;
  sexp_uint_t sizes [256];
  sexp_uint_t stats [256];
  size_t freed;
  ulong local_10e0;
  uint local_10d4;
  long in_stack_ffffffffffffef38;
  sexp_conflict in_stack_ffffffffffffef40;
  sexp_conflict in_stack_ffffffffffffef48;
  sexp_conflict psVar3;
  undefined8 *local_10a8;
  undefined8 local_10a0;
  undefined8 local_1098;
  undefined8 *local_1090;
  undefined8 local_1088;
  undefined8 local_1080;
  undefined8 *local_1078;
  undefined8 local_1070;
  undefined8 local_1068;
  uint *local_1060;
  uint *local_1058;
  uint *local_1050;
  int *local_1048;
  uint *local_1040;
  long *local_1038;
  ulong local_1030;
  ulong local_1028;
  ulong local_1020;
  long alStack_1018 [256];
  long alStack_818 [256];
  undefined1 local_18 [8];
  int local_10;
  long local_8;
  
  local_1020 = 0;
  local_1038 = *(long **)(in_RDI + 0x70);
  local_1048 = (int *)0x3e;
  local_1068 = 0x43e;
  local_10 = in_EDX;
  local_8 = in_RDI;
  memset(&local_1078,0,0x10);
  local_1080 = 0x43e;
  memset(&local_1090,0,0x10);
  local_1098 = 0x43e;
  memset(&local_10a8,0,0x10);
  psVar3 = (sexp_conflict)&DAT_0000043e;
  memset(&stack0xffffffffffffef40,0,0x10);
  lVar2 = local_8;
  if (local_10 != 0) {
    uVar1 = sexp_env_ref(local_8,*(undefined8 *)(local_8 + 0x10),
                         *(undefined8 *)(*(long *)(local_8 + 0x28) + 200),0x3e);
    local_1048 = (int *)sexp_parameter_ref(lVar2,uVar1);
    in_stack_ffffffffffffef38 = lVar2;
  }
  sexp_gc(local_8,local_18);
  for (local_1030 = 0; (long)local_1030 < 0x100; local_1030 = local_1030 + 1) {
    alStack_818[local_1030] = 0;
    alStack_1018[local_1030] = 0;
  }
  for (; local_1038 != (long *)0x0; local_1038 = (long *)local_1038[4]) {
    local_1040 = (uint *)(local_1038[5] + 0x20);
    local_1050 = (uint *)local_1038[3];
    local_1060 = (uint *)(local_1038[5] + *local_1038);
    while (local_1040 < local_1060) {
      for (local_1058 = *(uint **)(local_1050 + 2);
          local_1058 != (uint *)0x0 && local_1058 < local_1040;
          local_1058 = *(uint **)(local_1058 + 2)) {
        local_1050 = local_1058;
      }
      if (local_1058 == local_1040) {
        local_1040 = (uint *)((long)local_1040 + *(long *)local_1058);
      }
      else {
        if ((((ulong)local_1048 & 3) == 0) && (*local_1048 == 0x11)) {
          sexp_print_simple(psVar3,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                            (int)((ulong)in_stack_ffffffffffffef38 >> 0x20));
          if (*(long *)(local_1048 + 10) == 0) {
            putc(10,*(FILE **)(local_1048 + 8));
          }
          else if (*(ulong *)(local_1048 + 0xe) < *(ulong *)(local_1048 + 0x14)) {
            lVar2 = *(long *)(local_1048 + 0xe);
            *(long *)(local_1048 + 0xe) = lVar2 + 1;
            *(undefined1 *)(*(long *)(local_1048 + 10) + lVar2) = 10;
          }
          else {
            sexp_buffered_write_char(local_8,10,local_1048);
          }
        }
        if (*local_1040 < 0x100) {
          local_10d4 = *local_1040;
        }
        else {
          local_10d4 = 0xff;
        }
        alStack_818[local_10d4] = alStack_818[local_10d4] + 1;
        lVar2 = sexp_allocated_bytes(local_8,local_1040);
        local_1028 = lVar2 + 0x1fU & 0xffffffffffffffe0;
        if (local_1028 + 0x1f >> 5 < 0x100) {
          local_10e0 = local_1028 + 0x1f >> 5;
        }
        else {
          local_10e0 = 0xff;
        }
        alStack_1018[local_10e0] = alStack_1018[local_10e0] + 1;
        if (local_1020 < *local_1040) {
          local_1020 = (ulong)*local_1040;
        }
        local_1040 = (uint *)((long)local_1040 + local_1028);
      }
    }
  }
  local_1078 = &local_1068;
  local_1070 = *(undefined8 *)(local_8 + 0x6080);
  *(undefined8 ***)(local_8 + 0x6080) = &local_1078;
  local_1090 = &local_1080;
  local_1088 = *(undefined8 *)(local_8 + 0x6080);
  *(undefined8 ***)(local_8 + 0x6080) = &local_1090;
  local_10a8 = &local_1098;
  local_10a0 = *(undefined8 *)(local_8 + 0x6080);
  *(undefined8 ***)(local_8 + 0x6080) = &local_10a8;
  *(undefined1 **)(local_8 + 0x6080) = &stack0xffffffffffffef40;
  local_1068 = 0x23e;
  for (local_1030 = local_1020; 0 < (long)local_1030; local_1030 = local_1030 - 1) {
    if (alStack_818[local_1030] != 0) {
      uVar1 = sexp_string_to_symbol_op
                        (local_8,0,1,
                         *(undefined8 *)
                          (*(long *)(*(long *)(*(long *)(local_8 + 0x28) + 0x20) + 0x10 +
                                    local_1030 * 8) + 8));
      local_1098 = sexp_cons_op(local_8,0,2,uVar1,alStack_818[local_1030] << 1 | 1);
      local_1068 = sexp_cons_op(local_8,0,2,local_1098,local_1068);
    }
  }
  local_1080 = 0x23e;
  for (local_1030 = 0xff; -1 < (long)local_1030; local_1030 = local_1030 + -1) {
    if (alStack_1018[local_1030] != 0) {
      local_1098 = sexp_cons_op(local_8,0,2,local_1030 << 1 | 1,alStack_1018[local_1030] << 1 | 1);
      local_1080 = sexp_cons_op(local_8,0,2,local_1098,local_1080);
    }
  }
  psVar3 = (sexp_conflict)sexp_cons_op(local_8,0,2,local_1068,local_1080);
  *(undefined8 *)(local_8 + 0x6080) = local_1070;
  return psVar3;
}

Assistant:

static sexp sexp_heap_walk (sexp ctx, int depth, int printp) {
  size_t freed;
  sexp_uint_t stats[256], sizes[256], hi_type=0, size;
  sexp_sint_t i;
  sexp_heap h = sexp_context_heap(ctx);
  sexp p, out=SEXP_FALSE;
  sexp_free_list q, r;
  char *end;
  sexp_gc_var4(stats_res, res, tmp, name);

  if (printp)
    out = sexp_parameter_ref(ctx,
                             sexp_env_ref(ctx,
                                          sexp_context_env(ctx),
                                          sexp_global(ctx,SEXP_G_CUR_OUT_SYMBOL),
                                          SEXP_FALSE));

  /* run gc once to remove unused variables */
  sexp_gc(ctx, &freed);

  /* initialize stats */
  for (i=0; i<256; i++) { stats[i]=0; sizes[i]=0; }

  /* loop over each heap chunk */
  for ( ; h; h=h->next) {
    p = (sexp) (h->data + sexp_heap_align(sexp_sizeof(pair)));
    q = h->free_list;
    end = (char*)h->data + h->size;
    while (((char*)p) < end) {
      /* find the preceding and succeeding free list pointers */
      for (r=q->next; r && ((char*)r<(char*)p); q=r, r=r->next)
        ;
      if ((char*)r == (char*)p) { /* this is a free block, skip */
        p = (sexp) (((char*)p) + r->size);
        continue;
      }
      /* otherwise maybe print, then increment the stat and continue */
      if (sexp_oportp(out)) {
        sexp_print_simple(ctx, p, out, depth);
        sexp_write_char(ctx, '\n', out);
      }
      stats[sexp_pointer_tag(p) > 255 ? 255 : sexp_pointer_tag(p)]++;
      size = sexp_heap_align(sexp_allocated_bytes(ctx, p));
      sizes[sexp_heap_chunks(size) > 255 ? 255 : sexp_heap_chunks(size)]++;
      if (sexp_pointer_tag(p) > hi_type)
        hi_type = sexp_pointer_tag(p);
      p = (sexp) (((char*)p) + size);
    }
  }

  /* build and return results */
  sexp_gc_preserve4(ctx, stats_res, res, tmp, name);
  stats_res = SEXP_NULL;
  for (i=hi_type; i>0; i--)
    if (stats[i]) {
      name = sexp_string_to_symbol(ctx, sexp_type_name_by_index(ctx, i));
      tmp = sexp_cons(ctx, name, sexp_make_fixnum(stats[i]));
      stats_res = sexp_cons(ctx, tmp, stats_res);
    }
  res = SEXP_NULL;
  for (i=255; i>=0; i--)
    if (sizes[i]) {
      tmp = sexp_cons(ctx, sexp_make_fixnum(i), sexp_make_fixnum(sizes[i]));
      res = sexp_cons(ctx, tmp, res);
    }
  res = sexp_cons(ctx, stats_res, res);
  sexp_gc_release4(ctx);
  return res;
}